

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

void generate_info_set(MppBufSlotsImpl *impl,MppFrame frame,RK_U32 force_def_align)

{
  MppFrame pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  RK_S32 bpp;
  RK_U32 RVar5;
  RK_U32 RVar6;
  MppFrameFormat MVar7;
  RK_U32 RVar8;
  RK_U32 RVar9;
  MppFrameFormat MVar10;
  uint uVar11;
  uint height;
  RK_U32 RVar12;
  uint uVar13;
  RK_U32 val;
  MPP_RET MVar14;
  size_t v;
  MppFrameFormat MVar15;
  char *fmt;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  MppSysCfg local_88;
  ulong local_80;
  MppBufSlotInfoSet sys_cfg_info_set;
  
  RVar5 = mpp_frame_get_width(frame);
  RVar6 = mpp_frame_get_height(frame);
  MVar7 = mpp_frame_get_fmt(frame);
  RVar8 = mpp_frame_get_width(frame);
  RVar9 = mpp_frame_get_height(frame);
  MVar10 = mpp_frame_get_fmt(frame);
  MVar15 = MVar10 & 0xfffff;
  local_80 = (ulong)MVar15;
  if ((MVar15 | MPP_FMT_YUV422SP) == MPP_FMT_YUV422SP_10BIT) {
    iVar16 = 10;
  }
  else {
    iVar16 = (uint)(MVar15 == MPP_FMT_YUV444SP_10BIT) * 2 + 8;
  }
  uVar11 = mpp_frame_get_hor_stride(frame);
  height = mpp_frame_get_ver_stride(frame);
  RVar12 = RVar8;
  if (impl->hal_width_align != (AlignFunc)0x0) {
    RVar12 = (*impl->hal_width_align)(RVar8);
  }
  uVar13 = RVar12 * iVar16 >> 3;
  if (uVar11 != 0) {
    uVar13 = uVar11;
  }
  RVar12 = (*impl->hal_hor_align)(uVar13);
  if (uVar11 == 0) {
    uVar11 = RVar12;
  }
  if (height != 0) {
    RVar9 = height;
  }
  RVar9 = (*impl->hal_ver_align)(RVar9);
  if (height == 0) {
    height = RVar9;
  }
  if (force_def_align == 0) {
    height = RVar9;
    uVar11 = RVar12;
  }
  if ((MVar10 & 0xf00000) != MPP_FMT_YUV420SP) {
    if (*compat_ext_fbc_hdr_256_odd == 0) {
      uVar11 = RVar8 + 0x3f & 0xffffffc0;
    }
    else {
      uVar11 = RVar8 + 0xff & 0xfffffe00 | 0x100;
    }
    uVar11 = iVar16 * uVar11 >> 3;
  }
  uVar17 = (ulong)uVar11;
  uVar13 = (uint)local_80;
  if (uVar13 < 0x12) {
    if ((0x2000aU >> (uVar13 & 0x1f) & 1) == 0) {
      if ((0x300U >> (uVar13 & 0x1f) & 1) == 0) goto LAB_0012eb6e;
      goto LAB_0012eb95;
    }
    uVar17 = 10;
    uVar18 = uVar11 * 8;
LAB_0012eb8c:
    uVar17 = uVar18 / uVar17;
  }
  else {
LAB_0012eb6e:
    if (uVar13 - 0x10000 < 2) {
LAB_0012eb95:
      uVar17 = (ulong)(uVar11 >> 1);
    }
    else if (uVar13 - 0x10006 < 2) {
      uVar17 = 3;
      uVar18 = uVar11;
      goto LAB_0012eb8c;
    }
  }
  RVar9 = uVar11 * height;
  if ((MVar10 & 0xf00000) == MPP_FMT_YUV420SP) {
    if (impl->hal_len_align == (AlignFunc)0x0) {
      RVar9 = (RVar9 * impl->numerator) / impl->denominator;
    }
    else {
      RVar9 = (*impl->hal_len_align)(RVar9);
    }
    local_80 = CONCAT44(local_80._4_4_,RVar9);
  }
  else {
    uVar18 = (int)uVar17 + 0x3fU & 0xffffffc0;
    uVar17 = (ulong)uVar18;
    switch(local_80 & 0xffffffff) {
    case 0:
      bpp = 0xc;
      break;
    case 1:
      bpp = 0xf;
      break;
    case 2:
      bpp = 0x10;
      break;
    case 3:
      bpp = 0x14;
      break;
    default:
      if (uVar13 == 0xf) {
        bpp = 0x18;
        break;
      }
      if (uVar13 == 0x11) {
        bpp = 0x1e;
        break;
      }
      uVar13 = RVar9 * 3 >> 1;
      _mpp_log_l(2,"mpp_buf_slot","dec out fmt is no support",(char *)0x0);
      goto LAB_0012ec3b;
    }
    uVar13 = get_afbc_min_size(uVar18,height,bpp);
LAB_0012ec3b:
    local_80 = CONCAT44(local_80._4_4_,uVar13);
    mpp_frame_set_fbc_size(frame,(long)(int)uVar13);
  }
  RVar9 = mpp_frame_get_width(frame);
  RVar8 = mpp_frame_get_height(frame);
  RVar12 = mpp_frame_get_hor_stride(frame);
  val = mpp_frame_get_ver_stride(frame);
  MVar10 = mpp_frame_get_fmt(frame);
  MVar14 = mpp_sys_cfg_get(&local_88);
  if (MVar14 == MPP_OK) {
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:enable",1);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:type",impl->coding_type);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:fmt_codec",MVar10 & 0xfffff);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:fmt_fbc",MVar10 & 0xf00000);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:fmt_hdr",MVar10 & 0xc000000);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:width",RVar9);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:height",RVar8);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:h_stride_by_byte",RVar12);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:v_stride",val);
    mpp_sys_cfg_ioctl(local_88);
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:h_stride_by_byte",&sys_cfg_info_set.h_stride_by_byte);
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:h_stride_by_pixel",&sys_cfg_info_set.h_stride_by_pixel
                       );
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:v_stride",&sys_cfg_info_set.v_stride);
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:size_total",&sys_cfg_info_set.size_total);
    MVar14 = mpp_sys_cfg_put(local_88);
    if (MVar14 == MPP_OK) goto LAB_0012edef;
    fmt = "mpp_sys_cfg_put failed\n";
  }
  else {
    fmt = "mpp_sys_cfg_get failed\n";
  }
  _mpp_log_l(2,"mpp_buf_slot",fmt,(char *)0x0);
LAB_0012edef:
  mpp_frame_set_width(impl->info_set,RVar5);
  mpp_frame_set_height(impl->info_set,RVar6);
  mpp_frame_set_fmt(impl->info_set,MVar7);
  RVar9 = use_legacy_align;
  uVar13 = uVar11;
  if (use_legacy_align == 0) {
    uVar13 = sys_cfg_info_set.h_stride_by_byte;
  }
  mpp_frame_set_hor_stride(impl->info_set,uVar13);
  uVar13 = height;
  if (RVar9 == 0) {
    uVar13 = sys_cfg_info_set.v_stride;
  }
  mpp_frame_set_ver_stride(impl->info_set,uVar13);
  RVar6 = (RK_U32)uVar17;
  RVar5 = RVar6;
  if (RVar9 == 0) {
    RVar5 = sys_cfg_info_set.h_stride_by_pixel;
  }
  mpp_frame_set_hor_stride_pixel(impl->info_set,RVar5);
  uVar18 = (uint)local_80;
  uVar13 = sys_cfg_info_set.size_total;
  if (RVar9 != 0) {
    uVar13 = (uint)local_80;
  }
  mpp_frame_set_buf_size(impl->info_set,(ulong)uVar13);
  uVar13 = sys_cfg_info_set.size_total;
  if (RVar9 != 0) {
    uVar13 = uVar18;
  }
  mpp_frame_set_buf_size(frame,(ulong)uVar13);
  uVar13 = uVar11;
  if (RVar9 == 0) {
    uVar13 = sys_cfg_info_set.h_stride_by_byte;
  }
  mpp_frame_set_hor_stride(frame,uVar13);
  uVar13 = height;
  if (RVar9 == 0) {
    uVar13 = sys_cfg_info_set.v_stride;
  }
  mpp_frame_set_ver_stride(frame,uVar13);
  RVar5 = RVar6;
  if (RVar9 == 0) {
    RVar5 = sys_cfg_info_set.h_stride_by_pixel;
  }
  mpp_frame_set_hor_stride_pixel(frame,RVar5);
  uVar18 = (uint)local_80;
  uVar13 = sys_cfg_info_set.size_total;
  if (RVar9 != 0) {
    uVar13 = (uint)local_80;
  }
  impl->buf_size = (ulong)uVar13;
  RVar9 = mpp_frame_get_thumbnail_en(frame);
  if (RVar9 == 1) {
    RVar9 = mpp_frame_get_height(frame);
    RVar5 = mpp_frame_get_width(frame);
    uVar13 = ((RVar5 >> 1) + 0xf & 0xffffff0) * ((RVar9 >> 1) + 0xf & 0xfffffff0);
    MVar7 = MVar7 & 0xfffff;
    uVar18 = (uint)local_80;
    if (MVar7 < MPP_FMT_YUV422SP) {
      uVar13 = uVar13 * 3 >> 1;
    }
    else if (MVar7 - MPP_FMT_YUV422SP < 2) {
      uVar13 = uVar13 * 2;
    }
    else if (MVar7 != MPP_FMT_YUV400) {
      if ((MVar7 == MPP_FMT_YUV444SP) || (MVar7 == MPP_FMT_YUV444SP_10BIT)) {
        uVar13 = uVar13 * 3;
      }
      else {
        uVar13 = uVar13 * 3 >> 1;
      }
    }
    v = (ulong)uVar13 + impl->buf_size;
    impl->buf_size = v;
    mpp_frame_set_buf_size(impl->info_set,v);
    mpp_frame_set_buf_size(frame,impl->buf_size);
  }
  pvVar1 = impl->info_set;
  uVar2 = *(undefined4 *)((long)frame + 0x58);
  uVar3 = *(undefined4 *)((long)frame + 0x5c);
  uVar4 = *(undefined4 *)((long)frame + 0x60);
  *(undefined4 *)((long)pvVar1 + 0x54) = *(undefined4 *)((long)frame + 0x54);
  *(undefined4 *)((long)pvVar1 + 0x58) = uVar2;
  *(undefined4 *)((long)pvVar1 + 0x5c) = uVar3;
  *(undefined4 *)((long)pvVar1 + 0x60) = uVar4;
  *(undefined4 *)((long)pvVar1 + 100) = *(undefined4 *)((long)frame + 100);
  if (impl->align_chk_log_en != 0) {
    impl->align_chk_log_en = 0;
    if (RVar6 != sys_cfg_info_set.h_stride_by_pixel) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch h_stride_by_pixel %d - %d\n",(char *)0x0,uVar17);
    }
    if (uVar11 != sys_cfg_info_set.h_stride_by_byte) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch h_stride_by_byte %d - %d\n",(char *)0x0);
    }
    if (height != sys_cfg_info_set.v_stride) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch v_stride %d - %d\n",(char *)0x0,(ulong)height);
    }
    if (uVar18 != sys_cfg_info_set.size_total) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch size_total %d - %d\n",(char *)0x0,(ulong)uVar18);
    }
  }
  return;
}

Assistant:

static void generate_info_set(MppBufSlotsImpl *impl, MppFrame frame, RK_U32 force_def_align)
{
    const RK_U32 width  = mpp_frame_get_width(frame);
    const RK_U32 height = mpp_frame_get_height(frame);
    const MppFrameFormat fmt = mpp_frame_get_fmt(frame);
    MppBufSlotInfoSet legacy_info_set;
    MppBufSlotInfoSet sys_cfg_info_set;
    MppBufSlotInfoSet *info_set_ptr = NULL;
    MppFrameImpl *info_set_impl = NULL;
    MppFrameImpl *frame_impl = NULL;

    prepare_info_set_legacy(impl, frame, &legacy_info_set, force_def_align);
    prepare_info_set_by_sys_cfg(impl, frame, &sys_cfg_info_set);

    mpp_frame_set_width(impl->info_set, width);
    mpp_frame_set_height(impl->info_set, height);
    mpp_frame_set_fmt(impl->info_set, fmt);
    info_set_ptr = use_legacy_align ? &legacy_info_set : &sys_cfg_info_set;
    mpp_frame_set_hor_stride(impl->info_set, info_set_ptr->h_stride_by_byte);
    mpp_frame_set_ver_stride(impl->info_set, info_set_ptr->v_stride);
    mpp_frame_set_hor_stride_pixel(impl->info_set, info_set_ptr->h_stride_by_pixel);
    mpp_frame_set_buf_size(impl->info_set, info_set_ptr->size_total);
    mpp_frame_set_buf_size(frame, info_set_ptr->size_total);
    mpp_frame_set_hor_stride(frame, info_set_ptr->h_stride_by_byte);
    mpp_frame_set_ver_stride(frame, info_set_ptr->v_stride);
    mpp_frame_set_hor_stride_pixel(frame, info_set_ptr->h_stride_by_pixel);
    impl->buf_size = info_set_ptr->size_total;

    if (mpp_frame_get_thumbnail_en(frame) == MPP_FRAME_THUMBNAIL_MIXED) {
        /*
         * The decode hw only support 1/2 scaling in width and height,
         * downscale output image only support raster mode with 8bit depth.
         */
        RK_U32 down_scale_ver = MPP_ALIGN(mpp_frame_get_height(frame) >> 1, 16);
        RK_U32 down_scale_hor = MPP_ALIGN(mpp_frame_get_width(frame) >> 1, 16);
        RK_U32 downscale_buf_size;
        RK_U32 down_scale_y_virstride = down_scale_ver * down_scale_hor;

        switch ((fmt & MPP_FRAME_FMT_MASK)) {
        case MPP_FMT_YUV400 : {
            downscale_buf_size = down_scale_y_virstride;
        } break;
        case MPP_FMT_YUV420SP_10BIT :
        case MPP_FMT_YUV420SP : {
            downscale_buf_size = down_scale_y_virstride * 3 / 2;
        } break;
        case MPP_FMT_YUV422SP_10BIT :
        case MPP_FMT_YUV422SP : {
            downscale_buf_size = down_scale_y_virstride * 2;
        } break;
        case MPP_FMT_YUV444SP_10BIT :
        case MPP_FMT_YUV444SP : {
            downscale_buf_size = down_scale_y_virstride * 3;
        } break;
        default : {
            downscale_buf_size = down_scale_y_virstride * 3 / 2;
        } break;
        }
        downscale_buf_size = MPP_ALIGN(downscale_buf_size, 16);
        impl->buf_size += downscale_buf_size;
        mpp_frame_set_buf_size(impl->info_set, impl->buf_size);
        mpp_frame_set_buf_size(frame, impl->buf_size);
    }
    info_set_impl = (MppFrameImpl *)impl->info_set;
    frame_impl    = (MppFrameImpl *)frame;
    info_set_impl->color_range      = frame_impl->color_range;
    info_set_impl->color_primaries  = frame_impl->color_primaries;
    info_set_impl->color_trc        = frame_impl->color_trc;
    info_set_impl->colorspace       = frame_impl->colorspace;
    info_set_impl->chroma_location  = frame_impl->chroma_location;

    if (impl->align_chk_log_en) {
        impl->align_chk_log_en = 0;
        if (legacy_info_set.h_stride_by_pixel != sys_cfg_info_set.h_stride_by_pixel)
            mpp_logi("mismatch h_stride_by_pixel %d - %d\n",
                     legacy_info_set.h_stride_by_pixel,
                     sys_cfg_info_set.h_stride_by_pixel);
        if (legacy_info_set.h_stride_by_byte != sys_cfg_info_set.h_stride_by_byte)
            mpp_logi("mismatch h_stride_by_byte %d - %d\n",
                     legacy_info_set.h_stride_by_byte,
                     sys_cfg_info_set.h_stride_by_byte);
        if (legacy_info_set.v_stride != sys_cfg_info_set.v_stride)
            mpp_logi("mismatch v_stride %d - %d\n",
                     legacy_info_set.v_stride,
                     sys_cfg_info_set.v_stride);
        if (legacy_info_set.size_total != sys_cfg_info_set.size_total)
            mpp_logi("mismatch size_total %d - %d\n",
                     legacy_info_set.size_total,
                     sys_cfg_info_set.size_total);
    }
}